

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

string * __thiscall
cfd::core::ScriptOperator::ToCodeString_abi_cxx11_
          (string *__return_storage_ptr__,ScriptOperator *this)

{
  string *psVar1;
  uint __val;
  long lVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  uint uVar6;
  size_type *psVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint __len;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar1 = &this->text_data_;
  iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "OP_0";
    pcVar9 = "";
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "OP_1NEGATE";
      pcVar9 = "";
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        if (0xe < this->data_type_ - kOp_2) {
          ToString_abi_cxx11_(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        uVar11 = this->data_type_ - kOpReserved;
        __val = -uVar11;
        if (0 < (int)uVar11) {
          __val = uVar11;
        }
        __len = 1;
        if (9 < __val) {
          uVar8 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar6 = (uint)uVar8;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_0031257d;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_0031257d;
            }
            if (uVar6 < 10000) goto LAB_0031257d;
            uVar8 = uVar8 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_0031257d:
        local_50[0] = local_40;
        ::std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)__len - (char)((int)uVar11 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_50[0] + (uVar11 >> 0x1f),__len,__val);
        plVar5 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x5e653a);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar2 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_50[0] == local_40) {
          return __return_storage_ptr__;
        }
        operator_delete(local_50[0]);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar10 = "OP_1";
      pcVar9 = "";
    }
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar9)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToCodeString() const {
  if (text_data_ == "0") {
    return "OP_0";
  } else if (text_data_ == "-1") {
    return "OP_1NEGATE";
  } else if (text_data_ == "1") {
    return "OP_1";
  } else if (
      (data_type_ >= ScriptType::kOp_2) &&
      (data_type_ <= ScriptType::kOp_16)) {
    int num = static_cast<int>(data_type_);
    num -= static_cast<int>(ScriptType::kOp_1);
    num += 1;
    return "OP_" + std::to_string(num);
  }
  return ToString();
}